

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  Rep *this_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  CppType CVar4;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar5;
  LogMessage *pLVar6;
  LogFinisher local_142;
  byte local_141;
  LogMessage local_140;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  LogFinisher local_c5 [20];
  byte local_b1;
  LogMessage local_b0;
  Extension *local_78;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  Rep *local_50;
  RepeatedPtrField<google::protobuf::MessageLite> *local_48;
  RepeatedPtrField<google::protobuf::MessageLite> local_40;
  RepeatedPtrField<google::protobuf::MessageLite> *local_28;
  RepeatedPtrField<google::protobuf::MessageLite> *t;
  byte local_11;
  Rep *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  iVar2 = FieldDescriptor::number(descriptor);
  bVar1 = MaybeNewExtension(this,iVar2,(FieldDescriptor *)extension,&local_78);
  if (bVar1) {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)extension);
    local_78->type = (FieldType)TVar3;
    CVar4 = cpp_type(local_78->type);
    local_b1 = 0;
    if (CVar4 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xf4);
      local_b1 = 1;
      pLVar6 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(local_c5,pLVar6);
    }
    if ((local_b1 & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    local_78->is_repeated = true;
    this_00 = (Rep *)this->arena_;
    local_50 = this_00;
    if (this_00 == (Rep *)0x0) {
      pRVar5 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField(pRVar5);
      local_48 = pRVar5;
    }
    else {
      local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.rep_ = this_00;
      local_11 = Arena::
                 SkipDeleteList<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                           (0);
      t = &local_40;
      local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)this_00;
      local_10 = this_00;
      pRVar5 = (RepeatedPtrField<google::protobuf::MessageLite> *)
               Arena::AllocateAligned
                         ((Arena *)this_00,
                          (type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                          0x18);
      RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                (pRVar5,(t->super_RepeatedPtrFieldBase).arena_);
      local_28 = pRVar5;
      if ((local_11 & 1) == 0) {
        Arena::AddListNode((Arena *)this_00,pRVar5,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          );
      }
      local_48 = local_28;
    }
    (local_78->field_0).repeated_message_value = local_48;
  }
  else {
    iVar2 = 1;
    if ((local_78->is_repeated & 1U) != 0) {
      iVar2 = 3;
    }
    local_101 = 0;
    if (iVar2 != 3) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xf9);
      local_101 = 1;
      pLVar6 = LogMessage::operator<<
                         (&local_100,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_REPEATED): "
                         );
      LogFinisher::operator=(&local_102,pLVar6);
    }
    if ((local_101 & 1) != 0) {
      LogMessage::~LogMessage(&local_100);
    }
    CVar4 = cpp_type(local_78->type);
    local_141 = 0;
    if (CVar4 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_140,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xf9);
      local_141 = 1;
      pLVar6 = LogMessage::operator<<
                         (&local_140,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_142,pLVar6);
    }
    if ((local_141 & 1) != 0) {
      LogMessage::~LogMessage(&local_140);
    }
  }
  return local_78;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        ::google::protobuf::Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}